

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O1

void __thiscall
gss::innards::HomomorphismModel::_build_k4_graphs
          (HomomorphismModel *this,
          vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *graph_rows,
          uint size,uint *idx,bool pattern)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  SVOBitset *pSVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  void *pvVar14;
  undefined1 *puVar15;
  ulong *puVar16;
  _List_node_base *p_Var17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  pointer pSVar22;
  int iVar23;
  ulong uVar24;
  pointer pSVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  pointer pSVar29;
  pointer pSVar30;
  uint uVar31;
  uint uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  value_type nv;
  value_type common_neighbours;
  value_type cn1;
  value_type cn2;
  undefined1 local_258 [128];
  uint local_1d8;
  anon_union_128_2_84168a9f_for__data local_1d0;
  uint local_150;
  undefined1 local_148 [64];
  undefined1 local_108 [64];
  uint local_c8;
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  uint local_38;
  undefined1 auVar35 [32];
  
  if (size != 0) {
    uVar26 = 0;
    do {
      SVOBitset::SVOBitset
                ((SVOBitset *)local_258,
                 (graph_rows->
                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                 )._M_impl.super__Vector_impl_data._M_start + this->max_graphs * uVar26);
      if (uVar26 != 0) {
        uVar10 = uVar26 + 0x3f;
        if (-1 < (int)uVar26) {
          uVar10 = uVar26;
        }
        bVar5 = (byte)uVar26 & 0x3f;
        uVar20 = 0;
        do {
          pSVar11 = (SVOBitset *)local_258;
          if (0x10 < local_1d8) {
            pSVar11 = (SVOBitset *)local_258._0_8_;
          }
          uVar9 = (uint)uVar20;
          uVar18 = uVar9 + 0x3f;
          if (-1 < (int)uVar9) {
            uVar18 = uVar9;
          }
          iVar23 = (int)uVar18 >> 6;
          if (((pSVar11->_data).short_data[iVar23] >> (uVar20 & 0x3f) & 1) != 0) {
            SVOBitset::SVOBitset
                      ((SVOBitset *)&local_1d0,
                       (graph_rows->
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       )._M_impl.super__Vector_impl_data._M_start + this->max_graphs * uVar9);
            SVOBitset::operator&=((SVOBitset *)&local_1d0,(SVOBitset *)local_258);
            uVar18 = local_150;
            uVar28 = (ulong)local_150;
            uVar12 = &local_1d0;
            if (0x10 < uVar28) {
              uVar12 = local_1d0.short_data[0];
            }
            *(ulong *)(uVar12 + (long)((int)uVar10 >> 6) * 8) =
                 *(ulong *)(uVar12 + (long)((int)uVar10 >> 6) * 8) &
                 (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
            auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            uVar12 = &local_1d0;
            if (0x10 < uVar28) {
              uVar12 = local_1d0.long_data;
            }
            uVar20 = 1L << (uVar20 & 0x3f);
            *(ulong *)(uVar12 + (long)iVar23 * 8) = *(ulong *)(uVar12 + (long)iVar23 * 8) & ~uVar20;
            uVar12 = local_1d0.long_data;
            uVar13 = &local_1d0;
            if (0x10 < uVar28) {
              uVar13 = local_1d0.long_data;
            }
            if (uVar28 != 0) {
              auVar37 = vpbroadcastq_avx512f();
              uVar24 = 0;
              auVar38 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar40 = auVar38;
                auVar38 = vpbroadcastq_avx512f();
                auVar38 = vporq_avx512f(auVar38,auVar36);
                uVar7 = vpcmpuq_avx512f(auVar38,auVar37,2);
                auVar38 = vmovdqu64_avx512f(*(undefined1 (*) [64])(uVar13 + uVar24 * 8));
                auVar39._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar38._8_8_;
                auVar39._0_8_ = (ulong)((byte)uVar7 & 1) * auVar38._0_8_;
                auVar39._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar38._16_8_;
                auVar39._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar38._24_8_;
                auVar39._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar38._32_8_;
                auVar39._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar38._40_8_;
                auVar39._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar38._48_8_;
                auVar39._56_8_ = (uVar7 >> 7) * auVar38._56_8_;
                auVar38 = vpopcntq_avx512_vpopcntdq(auVar39);
                auVar34 = vpmovqd_avx512f(auVar38);
                auVar34 = vpaddd_avx2(auVar40._0_32_,auVar34);
                uVar24 = uVar24 + 8;
                auVar38 = ZEXT3264(auVar34);
              } while ((uVar28 + 7 & 0xfffffffffffffff8) != uVar24);
              auVar34 = vmovdqa32_avx512vl(auVar34);
              bVar4 = (bool)((byte)uVar7 & 1);
              auVar33._0_4_ = (uint)bVar4 * auVar34._0_4_ | (uint)!bVar4 * auVar40._0_4_;
              bVar4 = (bool)((byte)(uVar7 >> 1) & 1);
              auVar33._4_4_ = (uint)bVar4 * auVar34._4_4_ | (uint)!bVar4 * auVar40._4_4_;
              bVar4 = (bool)((byte)(uVar7 >> 2) & 1);
              auVar33._8_4_ = (uint)bVar4 * auVar34._8_4_ | (uint)!bVar4 * auVar40._8_4_;
              bVar4 = (bool)((byte)(uVar7 >> 3) & 1);
              auVar33._12_4_ = (uint)bVar4 * auVar34._12_4_ | (uint)!bVar4 * auVar40._12_4_;
              bVar4 = (bool)((byte)(uVar7 >> 4) & 1);
              auVar35._16_4_ = (uint)bVar4 * auVar34._16_4_ | (uint)!bVar4 * auVar40._16_4_;
              auVar35._0_16_ = auVar33;
              bVar4 = (bool)((byte)(uVar7 >> 5) & 1);
              auVar35._20_4_ = (uint)bVar4 * auVar34._20_4_ | (uint)!bVar4 * auVar40._20_4_;
              bVar4 = (bool)((byte)(uVar7 >> 6) & 1);
              auVar35._24_4_ = (uint)bVar4 * auVar34._24_4_ | (uint)!bVar4 * auVar40._24_4_;
              bVar4 = SUB81(uVar7 >> 7,0);
              auVar35._28_4_ = (uint)bVar4 * auVar34._28_4_ | (uint)!bVar4 * auVar40._28_4_;
              auVar33 = vphaddd_avx(auVar35._16_16_,auVar33);
              auVar33 = vphaddd_avx(auVar33,auVar33);
              auVar33 = vphaddd_avx(auVar33,auVar33);
              if (1 < auVar33._0_4_) {
                if (uVar18 < 0x11) {
                  local_c8 = uVar18;
                  auVar36._8_56_ = local_1d0._8_56_;
                  auVar36._0_8_ = local_1d0.short_data[0];
                  auVar36 = vmovdqu64_avx512f(auVar36);
                  auVar38 = vmovdqu64_avx512f(local_1d0._64_64_);
                  local_148 = vmovdqu64_avx512f(auVar36);
                  local_108 = vmovdqu64_avx512f(auVar38);
                }
                else {
                  local_c8 = uVar18;
                  pvVar14 = operator_new__(uVar28 << 3);
                  local_148._0_8_ = pvVar14;
                  memmove(pvVar14,(void *)uVar12,uVar28 << 3);
                }
                uVar18 = local_c8;
                uVar28 = (ulong)local_c8;
                puVar16 = (ulong *)local_148;
                if (0x10 < uVar28) {
                  puVar16 = (ulong *)local_148._0_8_;
                }
                uVar32 = 0xffffffff;
                if (uVar28 != 0) {
                  lVar21 = 0;
LAB_001311f0:
                  uVar24 = *puVar16;
                  if (uVar24 == 0) goto code_r0x001311f8;
                  iVar8 = 0;
                  for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                    iVar8 = iVar8 + 1;
                  }
                  uVar32 = iVar8 - (int)lVar21;
                }
LAB_00131212:
                if (uVar32 != 0xffffffff) {
                  bVar4 = false;
                  do {
                    puVar15 = local_148;
                    if (0x10 < uVar18) {
                      puVar15 = (undefined1 *)local_148._0_8_;
                    }
                    bVar6 = (byte)uVar32 & 0x3f;
                    uVar19 = uVar32 + 0x3f;
                    if (-1 < (int)uVar32) {
                      uVar19 = uVar32;
                    }
                    *(ulong *)(puVar15 + (long)((int)uVar19 >> 6) * 8) =
                         *(ulong *)(puVar15 + (long)((int)uVar19 >> 6) * 8) &
                         (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
                    if ((ulong)local_150 < 0x11) {
                      local_38 = local_150;
                      auVar38._8_56_ = local_1d0._8_56_;
                      auVar38._0_8_ = local_1d0.short_data[0];
                      auVar36 = vmovdqu64_avx512f(auVar38);
                      auVar38 = vmovdqu64_avx512f(local_1d0._64_64_);
                      local_b8 = vmovdqu64_avx512f(auVar36);
                      local_78 = vmovdqu64_avx512f(auVar38);
                    }
                    else {
                      local_38 = local_150;
                      uVar24 = (ulong)local_150 << 3;
                      pvVar14 = operator_new__(uVar24);
                      local_b8._0_8_ = pvVar14;
                      memmove(pvVar14,local_1d0.long_data,uVar24);
                    }
                    uVar19 = local_38;
                    uVar24 = (ulong)local_38;
                    puVar16 = (ulong *)local_b8;
                    if (0x10 < uVar24) {
                      puVar16 = (ulong *)local_b8._0_8_;
                    }
                    uVar27 = 0xffffffff;
                    if (uVar24 != 0) {
                      lVar21 = 0;
LAB_00131308:
                      uVar7 = *puVar16;
                      if (uVar7 == 0) goto code_r0x00131310;
                      iVar8 = 0;
                      for (; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                        iVar8 = iVar8 + 1;
                      }
                      uVar27 = iVar8 - (int)lVar21;
                    }
LAB_00131329:
                    if (uVar27 != 0xffffffff && !bVar4) {
                      uVar31 = this->max_graphs;
                      pSVar30 = (graph_rows->
                                super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      pSVar25 = pSVar30 + uVar31 * uVar32;
                      pSVar29 = pSVar30 + (uVar31 * uVar26 + *idx);
                      pSVar30 = pSVar30 + (uVar31 * uVar9 + *idx);
                      do {
                        puVar15 = local_b8;
                        if (0x10 < uVar19) {
                          puVar15 = (undefined1 *)local_b8._0_8_;
                        }
                        uVar31 = uVar27 + 0x3f;
                        if (-1 < (int)uVar27) {
                          uVar31 = uVar27;
                        }
                        bVar6 = (byte)uVar27 & 0x3f;
                        *(ulong *)(puVar15 + (long)((int)uVar31 >> 6) * 8) =
                             *(ulong *)(puVar15 + (long)((int)uVar31 >> 6) * 8) &
                             (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
                        if ((((uVar9 != uVar27) && (uVar9 != uVar32)) && (uVar26 != uVar32)) &&
                           (uVar26 != uVar27)) {
                          pSVar22 = pSVar25;
                          if (0x10 < pSVar25->n_words) {
                            pSVar22 = (pointer)(pSVar25->_data).short_data[0];
                          }
                          if (((pSVar22->_data).short_data[(int)uVar31 >> 6] &
                              1L << ((ulong)uVar27 & 0x3f)) != 0) {
                            pSVar22 = pSVar29;
                            if (0x10 < pSVar29->n_words) {
                              pSVar22 = (pointer)(pSVar29->_data).short_data[0];
                            }
                            (pSVar22->_data).short_data[iVar23] =
                                 (pSVar22->_data).short_data[iVar23] | uVar20;
                            pSVar22 = pSVar30;
                            if (0x10 < pSVar30->n_words) {
                              pSVar22 = (pointer)(pSVar30->_data).short_data[0];
                            }
                            (pSVar22->_data).short_data[(int)uVar10 >> 6] =
                                 (pSVar22->_data).short_data[(int)uVar10 >> 6] |
                                 1L << ((ulong)uVar26 & 0x3f);
                            bVar4 = true;
                          }
                        }
                        puVar16 = (ulong *)local_b8;
                        if (0x10 < uVar19) {
                          puVar16 = (ulong *)local_b8._0_8_;
                        }
                        uVar27 = 0xffffffff;
                        if (uVar24 != 0) {
                          lVar21 = 0;
LAB_0013146b:
                          uVar7 = *puVar16;
                          if (uVar7 == 0) goto code_r0x00131473;
                          iVar8 = 0;
                          for (; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                            iVar8 = iVar8 + 1;
                          }
                          uVar27 = iVar8 - (int)lVar21;
                        }
LAB_0013148d:
                      } while ((uVar27 != 0xffffffff) && (!bVar4));
                    }
                    if ((0x10 < uVar19) && ((void *)local_b8._0_8_ != (void *)0x0)) {
                      operator_delete__((void *)local_b8._0_8_);
                    }
                    puVar16 = (ulong *)local_148;
                    if (0x10 < uVar18) {
                      puVar16 = (ulong *)local_148._0_8_;
                    }
                    uVar32 = 0xffffffff;
                    if (uVar28 != 0) {
                      lVar21 = 0;
LAB_001314dd:
                      uVar24 = *puVar16;
                      if (uVar24 == 0) goto code_r0x001314e5;
                      iVar8 = 0;
                      for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                        iVar8 = iVar8 + 1;
                      }
                      uVar32 = iVar8 - (int)lVar21;
                    }
LAB_001314ff:
                  } while ((uVar32 != 0xffffffff) && (!bVar4));
                }
                if ((0x10 < uVar18) && ((void *)local_148._0_8_ != (void *)0x0)) {
                  operator_delete__((void *)local_148._0_8_);
                }
              }
            }
            if ((0x10 < local_150) &&
               ((anon_union_128_2_84168a9f_for__data *)local_1d0.short_data[0] !=
                (anon_union_128_2_84168a9f_for__data *)0x0)) {
              operator_delete__(local_1d0.long_data);
            }
          }
          uVar20 = (ulong)(uVar9 + 1);
        } while (uVar9 + 1 != uVar26);
      }
      if ((0x10 < local_1d8) && ((SVOBitset *)local_258._0_8_ != (SVOBitset *)0x0)) {
        operator_delete__((void *)local_258._0_8_);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != size);
  }
  if (pattern) {
    _Var3._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    p_Var2 = (_List_node_base *)(local_258 + 0x10);
    local_258._0_8_ = p_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"k4","");
    p_Var17 = (_List_node_base *)operator_new(0x30);
    p_Var17[1]._M_next = p_Var17 + 2;
    if ((_List_node_base *)local_258._0_8_ == p_Var2) {
      p_Var17[2]._M_next = (_List_node_base *)CONCAT71(local_258._17_7_,local_258[0x10]);
      p_Var17[2]._M_prev = (_List_node_base *)local_258._24_8_;
    }
    else {
      p_Var17[1]._M_next = (_List_node_base *)local_258._0_8_;
      p_Var17[2]._M_next = (_List_node_base *)CONCAT71(local_258._17_7_,local_258[0x10]);
    }
    p_Var17[1]._M_prev = (_List_node_base *)local_258._8_8_;
    local_258._8_8_ = 0;
    local_258[0x10] = 0;
    local_258._0_8_ = p_Var2;
    std::__detail::_List_node_base::_M_hook(p_Var17);
    psVar1 = (size_t *)((long)&(_Var3._M_head_impl)->supplemental_graph_names + 0x10);
    *psVar1 = *psVar1 + 1;
    if ((_List_node_base *)local_258._0_8_ != p_Var2) {
      operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
    }
  }
  *idx = *idx + 1;
  return;
code_r0x001311f8:
  lVar21 = lVar21 + -0x40;
  puVar16 = puVar16 + 1;
  if (uVar28 * 0x40 + lVar21 == 0) goto LAB_00131212;
  goto LAB_001311f0;
code_r0x00131310:
  lVar21 = lVar21 + -0x40;
  puVar16 = puVar16 + 1;
  if (uVar24 * 0x40 + lVar21 == 0) goto LAB_00131329;
  goto LAB_00131308;
code_r0x00131473:
  lVar21 = lVar21 + -0x40;
  puVar16 = puVar16 + 1;
  if (uVar24 * 0x40 + lVar21 == 0) goto LAB_0013148d;
  goto LAB_0013146b;
code_r0x001314e5:
  lVar21 = lVar21 + -0x40;
  puVar16 = puVar16 + 1;
  if (uVar28 * 0x40 + lVar21 == 0) goto LAB_001314ff;
  goto LAB_001314dd;
}

Assistant:

auto HomomorphismModel::_build_k4_graphs(vector<SVOBitset> & graph_rows, unsigned size, unsigned & idx, bool pattern) -> void
{
    for (unsigned v = 0; v < size; ++v) {
        auto nv = graph_rows[v * max_graphs + 0];
        for (unsigned w = 0; w < v; ++w) {
            if (nv.test(w)) {
                // are there two common neighbours with an edge between them?
                auto common_neighbours = graph_rows[w * max_graphs + 0];
                common_neighbours &= nv;
                common_neighbours.reset(v);
                common_neighbours.reset(w);
                auto count = common_neighbours.count();
                if (count >= 2) {
                    bool done = false;
                    auto cn1 = common_neighbours;
                    for (auto x = cn1.find_first(); x != decltype(cn1)::npos && ! done; x = cn1.find_first()) {
                        cn1.reset(x);
                        auto cn2 = common_neighbours;
                        for (auto y = cn2.find_first(); y != decltype(cn2)::npos && ! done; y = cn2.find_first()) {
                            cn2.reset(y);
                            if (v != w && v != x && v != y && w != x && w != y && graph_rows[x * max_graphs + 0].test(y)) {
                                graph_rows[v * max_graphs + idx].set(w);
                                graph_rows[w * max_graphs + idx].set(v);
                                done = true;
                            }
                        }
                    }
                }
            }
        }
    }

    if (pattern)
        _imp->supplemental_graph_names.push_back("k4");
    ++idx;
}